

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::EndDeadOpHelperLifetimes(LinearScan *this,Instr *instr)

{
  RegNum RVar1;
  uint uVar2;
  Type pLVar3;
  code *pcVar4;
  bool bVar5;
  uint32 uVar6;
  undefined4 *puVar7;
  Type *ppLVar8;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  
  bVar5 = SkipNumberedInstr(this,instr);
  if ((!bVar5) &&
     (this_00 = this->opHelperSpilledLiveranges,
     (SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
     (this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
     super_SListNodeBase<Memory::ArenaAllocator>.next != this_00)) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      uVar2 = (*ppLVar8)->end;
      uVar6 = IR::Instr::GetNumber(instr);
      if (uVar6 < uVar2) {
        return;
      }
      if (this->currentOpHelperBlock == (OpHelperBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x989,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar7 = 0;
      }
      ppLVar8 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this->opHelperSpilledLiveranges->
                            super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      pLVar3 = *ppLVar8;
      SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (&this->opHelperSpilledLiveranges->
                  super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>,
                 this->opHelperSpilledLiveranges->allocator);
      if ((pLVar3->field_0x9c & 0x40) == 0) {
        RVar1 = pLVar3->reg;
        BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
        RVar1 = RVar1 & (RegXMM15|RegXMM14);
        (this->opHelperSpilledRegs).word =
             (this->opHelperSpilledRegs).word & (-2L << RVar1 | 0xfffffffffffffffeU >> 0x40 - RVar1)
        ;
      }
      pLVar3->field_0x9c = pLVar3->field_0x9c & 0x8f;
      this_00 = this->opHelperSpilledLiveranges;
    } while ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
             (this_00->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next != this_00);
  }
  return;
}

Assistant:

void
LinearScan::EndDeadOpHelperLifetimes(IR::Instr * instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    while (!this->opHelperSpilledLiveranges->Empty() &&
           this->opHelperSpilledLiveranges->Head()->end <= instr->GetNumber())
    {
        Lifetime * deadLifetime;

        // The lifetime doesn't extend beyond the helper block
        // No need to save and restore around the helper block
        Assert(this->IsInHelperBlock());

        deadLifetime = this->opHelperSpilledLiveranges->Head();
        this->opHelperSpilledLiveranges->RemoveHead();
        if (!deadLifetime->cantOpHelperSpill)
        {
            this->opHelperSpilledRegs.Clear(deadLifetime->reg);
        }
        deadLifetime->isOpHelperSpilled = false;
        deadLifetime->cantOpHelperSpill = false;
        deadLifetime->isOpHelperSpillAsArg = false;
    }
}